

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::COrConditionalWrapper::ToConditional
          (COrConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  CLabelStatement *this_00;
  CSeqStatement *this_01;
  pointer pIVar1;
  CSeqStatement *this_02;
  CLabel *in_RCX;
  CLabel local_158;
  CLabel local_138;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_118;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_110;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_108;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_100;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_f8;
  CLabel local_f0;
  CLabel local_d0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_b0;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a8;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_a0;
  unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
  local_98 [8];
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_90;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> ptr;
  CLabel local_80;
  CLabelStatement *local_50;
  CLabelStatement *pointer;
  CLabel labelMiddle;
  CLabel *labelFalse_local;
  CLabel *labelTrue_local;
  COrConditionalWrapper *this_local;
  
  CLabel::CLabel((CLabel *)&pointer);
  this_00 = (CLabelStatement *)operator_new(0x28);
  ptr._M_t.super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
  ._M_t.super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
  .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 1;
  CLabel::CLabel(&local_80,(CLabel *)&pointer);
  CLabelStatement::CLabelStatement(this_00,&local_80);
  ptr._M_t.super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
  ._M_t.super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
  .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl._7_1_ = 0;
  CLabel::~CLabel(&local_80);
  local_50 = this_00;
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>(local_98,this_00);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_90,
             (unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
              *)local_98);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr((unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>
               *)local_98);
  this_01 = (CSeqStatement *)operator_new(0x18);
  pIVar1 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                       *)&labelTrue->field_0x8);
  CLabel::CLabel(&local_d0,labelFalse);
  CLabel::CLabel(&local_f0,(CLabel *)&pointer);
  (*pIVar1->_vptr_ISubtreeWrapper[2])(&local_b0,pIVar1,&local_d0,&local_f0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_a8,&local_b0);
  this_02 = (CSeqStatement *)operator_new(0x18);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_108,&local_90);
  pIVar1 = std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::
           operator->((unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>
                       *)&labelTrue->field_0x10);
  CLabel::CLabel(&local_138,labelFalse);
  CLabel::CLabel(&local_158,in_RCX);
  (*pIVar1->_vptr_ISubtreeWrapper[2])(&local_118,pIVar1,&local_138,&local_158);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_110,&local_118);
  CSeqStatement::CSeqStatement(this_02,&local_108,&local_110);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_100,(pointer)this_02);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            (&local_f8,&local_100);
  CSeqStatement::CSeqStatement(this_01,&local_a8,&local_f8);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             &local_a0,(pointer)this_01);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this,
             &local_a0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_a0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_f8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_100);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_110);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_118);
  CLabel::~CLabel(&local_158);
  CLabel::~CLabel(&local_138);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_108);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_a8);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_b0);
  CLabel::~CLabel(&local_f0);
  CLabel::~CLabel(&local_d0);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (&local_90);
  CLabel::~CLabel((CLabel *)&pointer);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement> COrConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        CLabel labelMiddle;
        CLabelStatement *pointer = new CLabelStatement( labelMiddle );
        std::unique_ptr<const CStatement> ptr = std::unique_ptr<const CLabelStatement>( pointer );
        return std::move( std::unique_ptr<const CStatement>(
                new CSeqStatement(
                        std::move( operandLeft->ToConditional( labelTrue, labelMiddle )),
                        std::move( std::unique_ptr<const CStatement>(
                                new CSeqStatement(
                                        std::move( ptr ),
                                        std::move( operandRight->ToConditional( labelTrue, labelFalse ))
                                )
                        ))
                )
        ));
    }